

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O0

OptionBuilder * __thiscall
program_options::OptionBuilder::operator()(OptionBuilder *this,char *key,char *description)

{
  OptionBuilder *in_RDI;
  shared_ptr<program_options::option_description> option;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 zero_tokens;
  shared_ptr<program_options::option_description> *desc;
  untyped_value *in_stack_ffffffffffffff90;
  options_description *this_00;
  char **in_stack_ffffffffffffffb8;
  untyped_value **in_stack_ffffffffffffffc0;
  char **in_stack_ffffffffffffffc8;
  shared_ptr<program_options::option_description> local_28 [2];
  
  zero_tokens = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  operator_new(0x10);
  untyped_value::untyped_value(in_stack_ffffffffffffff90,(bool)zero_tokens);
  desc = local_28;
  std::
  make_shared<program_options::option_description,char_const*&,program_options::untyped_value*,char_const*&>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = in_RDI->m_root;
  std::shared_ptr<program_options::option_description>::shared_ptr
            ((shared_ptr<program_options::option_description> *)this_00,desc);
  options_description::add(this_00,desc);
  std::shared_ptr<program_options::option_description>::~shared_ptr
            ((shared_ptr<program_options::option_description> *)0x1f2de0);
  std::shared_ptr<program_options::option_description>::~shared_ptr
            ((shared_ptr<program_options::option_description> *)0x1f2dea);
  return in_RDI;
}

Assistant:

OptionBuilder& OptionBuilder::operator()(const char* key, const char* description) {
    auto option = std::make_shared<option_description>(key, new untyped_value(true), description);
    m_root.add(option);
    return *this;
}